

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void libyuv::YuvPixel8_16
               (uint8_t y,uint8_t u,uint8_t v,int *b,int *g,int *r,YuvConstants *yuvconstants)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  uint uVar6;
  uint32_t y1;
  int yg;
  int br;
  int bg;
  int bb;
  int vr;
  int vg;
  int ug;
  int ub;
  int *r_local;
  int *g_local;
  int *b_local;
  uint8_t v_local;
  uint8_t u_local;
  uint8_t y_local;
  
  cVar1 = yuvconstants->kUVToG[0];
  cVar2 = yuvconstants->kUVToG[1];
  cVar3 = yuvconstants->kUVToR[1];
  sVar4 = yuvconstants->kUVBiasG[0];
  sVar5 = yuvconstants->kUVBiasR[0];
  uVar6 = (uint)y * 0x101 * (int)yuvconstants->kYToRgb[0] >> 0x10;
  *b = (uVar6 - (uint)u * (int)yuvconstants->kUVToB[0]) + (int)yuvconstants->kUVBiasB[0];
  *g = (uVar6 - ((uint)u * (int)cVar1 + (uint)v * (int)cVar2)) + (int)sVar4;
  *r = (uVar6 - (uint)v * (int)cVar3) + (int)sVar5;
  return;
}

Assistant:

static __inline void YuvPixel8_16(uint8_t y,
                                  uint8_t u,
                                  uint8_t v,
                                  int* b,
                                  int* g,
                                  int* r,
                                  const struct YuvConstants* yuvconstants) {
#if defined(__aarch64__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = -yuvconstants->kUVToRB[1];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#elif defined(__arm__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[4];
  int vr = -yuvconstants->kUVToRB[4];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#else
  int ub = yuvconstants->kUVToB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = yuvconstants->kUVToR[1];
  int bb = yuvconstants->kUVBiasB[0];
  int bg = yuvconstants->kUVBiasG[0];
  int br = yuvconstants->kUVBiasR[0];
  int yg = yuvconstants->kYToRgb[0];
#endif

  uint32_t y1 = (uint32_t)(y * 0x0101 * yg) >> 16;
  *b = (int)(-(u * ub) + y1 + bb);
  *g = (int)(-(u * ug + v * vg) + y1 + bg);
  *r = (int)(-(v * vr) + y1 + br);
}